

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  int iVar1;
  IncorrectConstruction *__return_storage_ptr__;
  string sStack_38;
  
  iVar1 = get_items_expected(this);
  if (-1 < iVar1) {
    (this->super_OptionBase<CLI::Option>).multi_option_policy_ = value;
    return this;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  get_name_abi_cxx11_(&sStack_38,this,false,false);
  IncorrectConstruction::MultiOptionPolicy(__return_storage_ptr__,&sStack_38);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *multi_option_policy(MultiOptionPolicy value = MultiOptionPolicy::Throw) {

        if(get_items_expected() < 0)
            throw IncorrectConstruction::MultiOptionPolicy(get_name());
        multi_option_policy_ = value;
        return this;
    }